

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_Dsd6DecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  ulong *pTruth_00;
  int *pVars_00;
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  char (*pacVar12) [32];
  uint uVar13;
  int v;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  timespec ts;
  timespec local_a8;
  ulong *local_98;
  int *local_90;
  long local_88;
  char (*local_80) [32];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  Dau_Dsd_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char (*local_40) [8];
  ulong local_38;
  
  uVar6 = (ulong)(uint)nVars;
  local_98 = pTruth;
  local_90 = pVars;
  iVar1 = clock_gettime(3,&local_a8);
  if (iVar1 < 0) {
    local_88 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT62(local_a8.tv_nsec._2_6_,(undefined2)local_a8.tv_nsec)),8);
    local_88 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  pacVar12 = p->Cache;
  local_40 = p->pVarDefs;
  local_80 = pacVar12;
  local_60 = p;
  do {
    uVar4 = uVar6 - 1;
    local_58 = uVar6;
    if (1 < (int)uVar6) {
      uVar13 = (int)uVar6 - 2;
      do {
        uVar7 = (ulong)uVar13;
        uVar11 = uVar4 & 0xffffffff;
        local_38 = (ulong)(uint)(1 << ((byte)uVar4 & 0x1f));
        local_78 = uVar4;
        local_70 = uVar11;
        local_50 = uVar7;
        do {
          iVar1 = local_90[uVar11];
          iVar3 = local_90[uVar7];
          v = (int)uVar7;
          if (pacVar12[iVar1][iVar3] == '\0') {
            local_a8.tv_nsec._0_2_ = 0;
            local_a8.tv_sec = 0;
            local_68 = uVar6;
            if (6 < local_58) {
              __assert_fail("iVar >= 0 && iVar < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x337,"word Abc_Tt6Cofactor0(word, int)");
            }
            uVar16 = s_Truths6Neg[uVar11] & *local_98;
            uVar4 = *local_98 & s_Truths6[uVar11];
            uVar4 = uVar4 >> ((byte)local_38 & 0x3f) | uVar4;
            bVar9 = (byte)uVar7;
            bVar8 = (byte)(1 << (bVar9 & 0x1f));
            uVar16 = uVar16 << ((byte)local_38 & 0x3f) | uVar16;
            if (iVar1 == iVar3) {
              __assert_fail("v != u",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x459,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
            }
            iVar2 = (uint)((s_Truths6Neg[uVar7] & (uVar16 >> (bVar8 & 0x3f) ^ uVar16)) != 0) +
                    (uint)((s_Truths6Neg[uVar7] & (uVar4 >> (bVar8 & 0x3f) ^ uVar4)) != 0) * 2;
            if (2 < iVar2 - 1U) {
              __assert_fail("Status > 0 && Status < 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x45a,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
            }
            pacVar12[iVar1][iVar3] = (char)iVar2;
            uVar13 = (uint)uVar6;
            if (local_70 <= uVar7) {
              __assert_fail("v > u",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                            ,0x4ef,
                            "int Dau_Dsd6DecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                           );
            }
            uVar6 = s_Truths6Neg[uVar7];
            uVar11 = local_70;
            uVar15 = uVar13;
            if (iVar2 == 1) {
              uVar14 = 1 << (bVar9 & 0x1f);
              bVar9 = (byte)uVar14;
              if ((uVar6 & (uVar4 >> (bVar9 & 0x3f) ^ uVar16)) == 0) {
                sprintf((char *)&local_a8,"(!%c%c)",(ulong)(local_90[local_70] + 0x61),
                        (ulong)(local_90[uVar7] + 0x61));
                uVar6 = (uVar6 & uVar16) << (bVar9 & 0x3f) | uVar6 & uVar16;
                *local_98 = (((s_Truths6[uVar7] & uVar16) >> (bVar9 & 0x3f) | uVar16) ^ uVar6) &
                            s_Truths6[uVar7] ^ uVar6;
              }
              else {
                local_48 = (ulong)uVar14;
                if ((s_Truths6[uVar7] & (uVar4 ^ uVar16)) != 0) goto LAB_00510cc8;
                sprintf((char *)&local_a8,"(!%c!%c)",(ulong)(local_90[local_70] + 0x61),
                        (ulong)(local_90[uVar7] + 0x61));
                uVar11 = (uVar4 & s_Truths6[uVar7]) >> ((byte)local_48 & 0x3f);
                uVar11 = (((uVar6 & uVar16) << ((byte)local_48 & 0x3f) | uVar6 & uVar16) ^ uVar11) &
                         s_Truths6[uVar7] ^ uVar11;
LAB_00510a54:
                *local_98 = uVar11;
                pacVar12 = local_80;
              }
LAB_00510bbc:
              if ((char)local_a8.tv_sec == '\0') {
                __assert_fail("pBuffer[0]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x520,
                              "int Dau_Dsd6DecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                             );
              }
              sVar5 = strlen((char *)&local_a8);
              if (7 < sVar5) {
                __assert_fail("strlen(pStr) < 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              uVar13 = p->nVarsUsed;
              uVar6 = (ulong)(int)uVar13;
              if (0x1f < (long)uVar6) {
                __assert_fail("p->nVarsUsed < 32",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              uVar4 = uVar6;
              if (0 < (int)uVar13) {
                lVar10 = 0;
                do {
                  pacVar12[(int)uVar6][lVar10] = '\0';
                  lVar10 = lVar10 + 1;
                  uVar13 = p->nVarsUsed;
                  uVar6 = (ulong)uVar13;
                } while (lVar10 < (int)uVar13);
                uVar4 = (long)(int)uVar13;
                if (0 < (int)uVar13) {
                  lVar10 = 0;
                  do {
                    (*pacVar12)[(int)uVar6] = '\0';
                    lVar10 = lVar10 + 1;
                    uVar13 = p->nVarsUsed;
                    uVar6 = (ulong)uVar13;
                    uVar4 = (ulong)(int)uVar13;
                    pacVar12 = pacVar12 + 1;
                  } while (lVar10 < (long)uVar4);
                }
              }
              p->nVarsUsed = uVar13 + 1;
              strcpy(local_40[uVar4],(char *)&local_a8);
              uVar11 = local_70;
              pVars_00 = local_90;
              pTruth_00 = local_98;
              local_90[uVar7] = p->nVarsUsed + -1;
              uVar15 = (uint)local_68;
              uVar13 = uVar15 - 1;
              local_90[local_70] = local_90[(long)(int)uVar15 + -1];
              Abc_TtSwapVars(local_98,uVar15,(int)local_78,uVar13);
              iVar1 = Dau_Dsd6DecomposeSingleVarOne(local_60,pTruth_00,pVars_00,uVar13,v);
              p = local_60;
              if (iVar1 != 0) {
                uVar13 = Dau_Dsd6DecomposeSingleVar(local_60,local_98,local_90,uVar15 - 2);
                uVar11 = local_70;
                uVar15 = (uint)local_68;
              }
            }
            else if (iVar2 == 2) {
              if ((uVar6 & (uVar4 ^ uVar16)) == 0) {
                sprintf((char *)&local_a8,"(%c%c)",(ulong)(local_90[local_70] + 0x61),
                        (ulong)(local_90[uVar7] + 0x61));
                bVar9 = (byte)(1 << (bVar9 & 0x1f));
                uVar6 = (uVar6 & uVar16) << (bVar9 & 0x3f) | uVar6 & uVar16;
                *local_98 = (((s_Truths6[uVar7] & uVar4) >> (bVar9 & 0x3f) | uVar4) ^ uVar6) &
                            s_Truths6[uVar7] ^ uVar6;
                goto LAB_00510bbc;
              }
              bVar9 = (byte)(1 << (bVar9 & 0x1f));
              if ((uVar6 & (uVar4 >> (bVar9 & 0x3f) ^ uVar16)) == 0) {
                sprintf((char *)&local_a8,"(%c!%c)",(ulong)(local_90[local_70] + 0x61),
                        (ulong)(local_90[uVar7] + 0x61));
                uVar11 = (uVar16 & uVar6) << (bVar9 & 0x3f) | uVar16 & uVar6;
                uVar11 = (((uVar4 & uVar6) << (bVar9 & 0x3f) | uVar4 & uVar6) ^ uVar11) &
                         s_Truths6[uVar7] ^ uVar11;
                goto LAB_00510a54;
              }
            }
            else {
              bVar9 = (byte)(1 << (bVar9 & 0x1f));
              if (((uVar6 & (uVar4 >> (bVar9 & 0x3f) ^ uVar16)) == 0) &&
                 ((uVar6 & (uVar16 >> (bVar9 & 0x3f) ^ uVar4)) == 0)) {
                uVar6 = (uVar6 & uVar16) << (bVar9 & 0x3f) | uVar6 & uVar16;
                *local_98 = (((s_Truths6[uVar7] & uVar16) >> (bVar9 & 0x3f) | uVar16) ^ uVar6) &
                            s_Truths6[uVar7] ^ uVar6;
                sprintf((char *)&local_a8,"[%c%c]",(ulong)(local_90[local_70] + 0x61),
                        (ulong)(local_90[uVar7] + 0x61));
                pacVar12 = local_80;
                goto LAB_00510bbc;
              }
            }
LAB_00510cc8:
            if (uVar13 == 0) {
              iVar1 = clock_gettime(3,&local_a8);
              if (iVar1 < 0) {
                lVar10 = -1;
              }
              else {
                lVar10 = CONCAT62(local_a8.tv_nsec._2_6_,(undefined2)local_a8.tv_nsec) / 1000 +
                         local_a8.tv_sec * 1000000;
              }
              iVar1 = 0;
              goto LAB_00510da8;
            }
            uVar6 = (ulong)uVar13;
            pacVar12 = local_80;
            if ((int)uVar13 < (int)uVar15) {
              uVar6 = (ulong)uVar13;
              iVar1 = (int)local_78;
              goto LAB_00510d15;
            }
          }
          uVar7 = uVar7 - 1;
        } while (0 < v);
        uVar13 = (int)local_50 - 1;
        uVar4 = local_78 - 1;
        local_58 = local_78;
      } while (1 < (int)local_78);
    }
    iVar1 = (int)uVar4;
LAB_00510d15:
  } while (iVar1 != 0);
  iVar1 = (int)uVar6;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = CONCAT62(local_a8.tv_nsec._2_6_,(undefined2)local_a8.tv_nsec) / 1000 +
             local_a8.tv_sec * 1000000;
  }
LAB_00510da8:
  s_Times_1 = s_Times_1 + lVar10 + local_88;
  return iVar1;
}

Assistant:

int Dau_Dsd6DecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_Dsd6DecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}